

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O1

png_uint_32
png_get_pHYs_dpi(png_const_structrp png_ptr,png_const_inforp info_ptr,png_uint_32 *res_x,
                png_uint_32 *res_y,int *unit_type)

{
  byte bVar1;
  png_uint_32 pVar2;
  
  pVar2 = 0;
  if ((info_ptr != (png_const_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
     ((info_ptr->valid & 0x80) != 0)) {
    if (res_x == (png_uint_32 *)0x0) {
      pVar2 = 0;
    }
    else {
      *res_x = info_ptr->x_pixels_per_unit;
      pVar2 = 0x80;
    }
    if (res_y != (png_uint_32 *)0x0) {
      *res_y = info_ptr->y_pixels_per_unit;
      pVar2 = 0x80;
    }
    if (unit_type != (int *)0x0) {
      bVar1 = info_ptr->phys_unit_type;
      *unit_type = (uint)bVar1;
      pVar2 = 0x80;
      if (bVar1 == 1) {
        if (res_x != (png_uint_32 *)0x0) {
          *res_x = (png_uint_32)(long)((double)*res_x * 0.0254 + 0.5);
        }
        if (res_y != (png_uint_32 *)0x0) {
          *res_y = (png_uint_32)(long)((double)*res_y * 0.0254 + 0.5);
        }
      }
    }
  }
  return pVar2;
}

Assistant:

png_uint_32 PNGAPI
png_get_pHYs_dpi(png_const_structrp png_ptr, png_const_inforp info_ptr,
    png_uint_32 *res_x, png_uint_32 *res_y, int *unit_type)
{
   png_uint_32 retval = 0;

   png_debug1(1, "in %s retrieval function", "pHYs");

   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_pHYs) != 0)
   {
      if (res_x != NULL)
      {
         *res_x = info_ptr->x_pixels_per_unit;
         retval |= PNG_INFO_pHYs;
      }

      if (res_y != NULL)
      {
         *res_y = info_ptr->y_pixels_per_unit;
         retval |= PNG_INFO_pHYs;
      }

      if (unit_type != NULL)
      {
         *unit_type = (int)info_ptr->phys_unit_type;
         retval |= PNG_INFO_pHYs;

         if (*unit_type == 1)
         {
            if (res_x != NULL) *res_x = (png_uint_32)(*res_x * .0254 + .50);
            if (res_y != NULL) *res_y = (png_uint_32)(*res_y * .0254 + .50);
         }
      }
   }

   return retval;
}